

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teststop.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  sclock_t sVar2;
  sclock_t sVar3;
  double actual_fraction;
  double tenperc;
  double average;
  sclock_t diff;
  sclock_t start;
  int iterations;
  double diff_accum;
  double num_iterations;
  int microseconds;
  undefined1 local_40 [4];
  sclock_t resolution;
  SystemClock<(ClockType)2> clock;
  char **argv_local;
  int argc_local;
  
  clock.updater._M_id._M_thread = (id)(id)argv;
  SystemClock<(ClockType)2>::SystemClock((SystemClock<(ClockType)2> *)local_40,0);
  Clock::getResolution((Clock *)local_40);
  _start = 0.0;
  for (diff = 0.0; (double)(int)diff < 100000.0; diff = (sclock_t)((int)diff + 1)) {
    sVar2 = SystemClock<(ClockType)2>::stop((SystemClock<(ClockType)2> *)local_40);
    usleep(1000);
    sVar3 = SystemClock<(ClockType)2>::start((SystemClock<(ClockType)2> *)local_40);
    _start = (double)(sVar3 - sVar2) + _start;
  }
  _start = _start / 100000.0;
  bVar1 = std::isgreater(_start,0.0001);
  if (!bVar1) {
    fprintf(_stderr,"%.20f\n",(_start / 0.001) * 100.0);
    SystemClock<(ClockType)2>::~SystemClock((SystemClock<(ClockType)2> *)local_40);
    return 0;
  }
  fprintf(_stderr,"%.20f is greater than 10 percent (100 microseconds) of measured time.",_start);
  exit(1);
}

Assistant:

int 
main( int argc, char **argv )
{
   SystemClock< System > clock( 0 /** core zero **/ );   
   const auto resolution( clock.getResolution() );
   const auto microseconds( 1000 );
   const auto num_iterations( 1e5 );
   double diff_accum( 0.0 );
   for( auto iterations( 0 ); iterations < num_iterations; iterations++ )
   {
      volatile auto start( clock.stop() );
      usleep( (useconds_t) microseconds );
      volatile const auto diff( clock.start() - start );
      diff_accum += diff;
   }
   const double average( diff_accum / num_iterations );
   const double tenperc( .001 /** microseconds **/ * .10 );
   if( std::isgreater( average, tenperc ) )
   {
      std::fprintf( stderr, 
                    "%.20f is greater than 10 percent (100 microseconds) of measured time.", 
                    average );
      std::exit( EXIT_FAILURE );
   }
   const double actual_fraction( ( average / .001 ) * 100 );
   //print out the actual fraction of time we're off
   std::fprintf( stderr, "%.20f\n", actual_fraction );
   /** else return success **/
   return( EXIT_SUCCESS );
}